

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_state.cc
# Opt level: O2

void __thiscall
hwtest::pgraph::SurfOffsetRegister::sim_write
          (SurfOffsetRegister *this,pgraph_state *state,uint32_t val)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  byte bVar4;
  
  uVar1 = (this->super_IndexedMmioRegister<9>).super_MmioRegister.super_Register.mask;
  iVar3 = (*(this->super_IndexedMmioRegister<9>).super_MmioRegister.super_Register._vptr_Register[3]
          )();
  *(uint32_t *)CONCAT44(extraout_var,iVar3) = val & uVar1;
  *(byte *)state->valid = (byte)state->valid[0] | 8;
  if ((0x1f < (state->chipset).card_type) && ((state->surf_unk880 & 0x100000) == 0)) {
    iVar3 = (this->super_IndexedMmioRegister<9>).idx;
    bVar4 = (byte)iVar3;
    state->surf_unk888 =
         state->surf_unk888 & ~((uint)(1L << (bVar4 & 0x3e)) | (uint)(1L << (bVar4 & 0x3f | 1)));
    iVar2 = (state->chipset).chipset;
    if (iVar2 != 0x2a && 0x24 < iVar2) {
      bVar4 = (byte)(iVar3 << 2);
      state->surf_unk89c =
           state->surf_unk89c &
           ~((uint)(0xfL << (bVar4 & 0x38)) | (uint)(0xfL << (bVar4 & 0x3f | 4)));
    }
  }
  return;
}

Assistant:

void sim_write(struct pgraph_state *state, uint32_t val) override {
		ref(state) = val & mask;
		insrt(state->valid[0], 3, 1, 1);
		if (state->chipset.card_type >= 0x20 && !extr(state->surf_unk880, 20, 1)) {
			insrt(state->surf_unk888, idx & ~1, 1, 0);
			insrt(state->surf_unk888, idx | 1, 1, 0);
			if (nv04_pgraph_is_nv25p(&state->chipset)) {
				insrt(state->surf_unk89c, (idx & ~1) * 4, 4, 0);
				insrt(state->surf_unk89c, (idx | 1) * 4, 4, 0);
			}
		}
	}